

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImFontConfig *pIVar3;
  float fVar4;
  ImDrawList *draw_list;
  bool bVar5;
  bool bVar6;
  short sVar7;
  ImU32 IVar8;
  ImGuiStyle *v;
  char *pcVar9;
  size_t sVar10;
  ImGuiIO *pIVar11;
  ImFontGlyph *pIVar12;
  int i;
  long lVar13;
  ulong uVar14;
  void *ptr_id;
  uint uVar15;
  ImVec4 *pIVar16;
  ImWchar c;
  ImVec4 *pIVar17;
  int n;
  int iVar18;
  ImGuiStyle *__dest;
  int i_1;
  uint uVar19;
  ImFont *pIVar20;
  ImFontAtlas *pIVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  bool window_border;
  ImVec2 cell_p2;
  ImVec4 local_d0;
  ImFont *local_c0;
  float *local_b8;
  float local_ac;
  ImVec4 local_a8;
  ImFontAtlas *local_98;
  ulong local_90;
  void *local_88;
  ImDrawList *local_80;
  ImVec2 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  v = GetStyle();
  if (ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') {
    iVar18 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    if (iVar18 != 0) {
      ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    }
  }
  if ((ref == (ImGuiStyle *)0x0) && ((ShowStyleEditor(ImGuiStyle*)::init & 1) == 0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x338);
  }
  ShowStyleEditor(ImGuiStyle*)::init = 1;
  __dest = &ShowStyleEditor::ref_saved_style;
  if (ref != (ImGuiStyle *)0x0) {
    __dest = ref;
  }
  fVar22 = GetWindowWidth();
  PushItemWidth(fVar22 * 0.5);
  bVar5 = ShowStyleSelector("Colors##Selector");
  if (bVar5) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x338);
  }
  ShowFontSelector("Fonts##Selector");
  local_b8 = &v->FrameRounding;
  bVar5 = SliderFloat("FrameRounding",local_b8,0.0,12.0,"%.0f",1.0);
  if (bVar5) {
    v->GrabRounding = v->FrameRounding;
  }
  local_d0.x._0_1_ = 0.0 < v->WindowBorderSize;
  bVar5 = Checkbox("WindowBorder",(bool *)&local_d0);
  if (bVar5) {
    if (local_d0.x._0_1_ == '\0') {
      fVar22 = 0.0;
    }
    else {
      fVar22 = 1.0;
    }
    v->WindowBorderSize = fVar22;
  }
  SameLine(0.0,-1.0);
  local_d0.x._0_1_ = 0.0 < v->FrameBorderSize;
  bVar5 = Checkbox("FrameBorder",(bool *)&local_d0);
  if (bVar5) {
    if (local_d0.x._0_1_ == '\0') {
      fVar22 = 0.0;
    }
    else {
      fVar22 = 1.0;
    }
    v->FrameBorderSize = fVar22;
  }
  SameLine(0.0,-1.0);
  local_d0.x._0_1_ = 0.0 < v->PopupBorderSize;
  bVar5 = Checkbox("PopupBorder",(bool *)&local_d0);
  if (bVar5) {
    fVar22 = 1.0;
    if (local_d0.x._0_1_ == '\0') {
      fVar22 = 0.0;
    }
    v->PopupBorderSize = fVar22;
  }
  local_d0.x = 0.0;
  local_d0.y = 0.0;
  bVar5 = Button("Save Ref",(ImVec2 *)&local_d0);
  if (bVar5) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x338);
    memmove(__dest,v,0x338);
  }
  SameLine(0.0,-1.0);
  local_d0.x = 0.0;
  local_d0.y = 0.0;
  bVar5 = Button("Revert Ref",(ImVec2 *)&local_d0);
  if (bVar5) {
    memcpy(v,__dest,0x338);
  }
  SameLine(0.0,-1.0);
  ShowHelpMarker(
                "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export Colors\" below to save them somewhere."
                );
  bVar5 = TreeNode("Rendering");
  if (bVar5) {
    Checkbox("Anti-aliased lines",&v->AntiAliasedLines);
    SameLine(0.0,-1.0);
    ShowHelpMarker(
                  "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                  );
    Checkbox("Anti-aliased fill",&v->AntiAliasedFill);
    PushItemWidth(100.0);
    DragFloat("Curve Tessellation Tolerance",&v->CurveTessellationTol,0.02,0.1,3.4028235e+38,
              (char *)0x0,2.0);
    if (v->CurveTessellationTol <= 0.0 && v->CurveTessellationTol != 0.0) {
      v->CurveTessellationTol = 0.1;
    }
    DragFloat("Global Alpha",&v->Alpha,0.005,0.2,1.0,"%.2f",1.0);
    PopItemWidth();
    TreePop();
  }
  bVar5 = TreeNode("Settings");
  if (bVar5) {
    SliderFloat2("WindowPadding",&(v->WindowPadding).x,0.0,20.0,"%.0f",1.0);
    SliderFloat("PopupRounding",&v->PopupRounding,0.0,16.0,"%.0f",1.0);
    SliderFloat2("FramePadding",&(v->FramePadding).x,0.0,20.0,"%.0f",1.0);
    SliderFloat2("ItemSpacing",&(v->ItemSpacing).x,0.0,20.0,"%.0f",1.0);
    SliderFloat2("ItemInnerSpacing",&(v->ItemInnerSpacing).x,0.0,20.0,"%.0f",1.0);
    SliderFloat2("TouchExtraPadding",&(v->TouchExtraPadding).x,0.0,10.0,"%.0f",1.0);
    SliderFloat("IndentSpacing",&v->IndentSpacing,0.0,30.0,"%.0f",1.0);
    SliderFloat("ScrollbarSize",&v->ScrollbarSize,1.0,20.0,"%.0f",1.0);
    SliderFloat("GrabMinSize",&v->GrabMinSize,1.0,20.0,"%.0f",1.0);
    Text("BorderSize");
    SliderFloat("WindowBorderSize",&v->WindowBorderSize,0.0,1.0,"%.0f",1.0);
    SliderFloat("ChildBorderSize",&v->ChildBorderSize,0.0,1.0,"%.0f",1.0);
    SliderFloat("PopupBorderSize",&v->PopupBorderSize,0.0,1.0,"%.0f",1.0);
    SliderFloat("FrameBorderSize",&v->FrameBorderSize,0.0,1.0,"%.0f",1.0);
    Text("Rounding");
    SliderFloat("WindowRounding",&v->WindowRounding,0.0,14.0,"%.0f",1.0);
    SliderFloat("ChildRounding",&v->ChildRounding,0.0,16.0,"%.0f",1.0);
    SliderFloat("FrameRounding",local_b8,0.0,12.0,"%.0f",1.0);
    SliderFloat("ScrollbarRounding",&v->ScrollbarRounding,0.0,12.0,"%.0f",1.0);
    SliderFloat("GrabRounding",&v->GrabRounding,0.0,12.0,"%.0f",1.0);
    Text("Alignment");
    SliderFloat2("WindowTitleAlign",&(v->WindowTitleAlign).x,0.0,1.0,"%.2f",1.0);
    SliderFloat2("ButtonTextAlign",&(v->ButtonTextAlign).x,0.0,1.0,"%.2f",1.0);
    SameLine(0.0,-1.0);
    ShowHelpMarker("Alignment applies when a button is larger than its text content.");
    Text("Safe Area Padding");
    SameLine(0.0,-1.0);
    ShowHelpMarker(
                  "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                  );
    SliderFloat2("DisplaySafeAreaPadding",&(v->DisplaySafeAreaPadding).x,0.0,30.0,"%.0f",1.0);
    TreePop();
  }
  bVar5 = TreeNode("Colors");
  if (bVar5) {
    local_d0.x = 0.0;
    local_d0.y = 0.0;
    bVar5 = Button("Export Unsaved",(ImVec2 *)&local_d0);
    if (bVar5) {
      if (ShowStyleEditor::output_dest == 0) {
        LogToClipboard(-1);
      }
      else {
        LogToTTY(-1);
      }
      lVar13 = 0;
      LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
      pIVar17 = v->Colors;
      pIVar16 = __dest->Colors;
      do {
        pcVar9 = GetStyleColorName((ImGuiCol)lVar13);
        if ((ShowStyleEditor::output_only_modified != true) ||
           (auVar24[0] = -(*(char *)&pIVar16->x == *(char *)&pIVar17->x),
           auVar24[1] = -(*(char *)((long)&pIVar16->x + 1) == *(char *)((long)&pIVar17->x + 1)),
           auVar24[2] = -(*(char *)((long)&pIVar16->x + 2) == *(char *)((long)&pIVar17->x + 2)),
           auVar24[3] = -(*(char *)((long)&pIVar16->x + 3) == *(char *)((long)&pIVar17->x + 3)),
           auVar24[4] = -(*(char *)&pIVar16->y == *(char *)&pIVar17->y),
           auVar24[5] = -(*(char *)((long)&pIVar16->y + 1) == *(char *)((long)&pIVar17->y + 1)),
           auVar24[6] = -(*(char *)((long)&pIVar16->y + 2) == *(char *)((long)&pIVar17->y + 2)),
           auVar24[7] = -(*(char *)((long)&pIVar16->y + 3) == *(char *)((long)&pIVar17->y + 3)),
           auVar24[8] = -(*(char *)&pIVar16->z == *(char *)&pIVar17->z),
           auVar24[9] = -(*(char *)((long)&pIVar16->z + 1) == *(char *)((long)&pIVar17->z + 1)),
           auVar24[10] = -(*(char *)((long)&pIVar16->z + 2) == *(char *)((long)&pIVar17->z + 2)),
           auVar24[0xb] = -(*(char *)((long)&pIVar16->z + 3) == *(char *)((long)&pIVar17->z + 3)),
           auVar24[0xc] = -(*(char *)&pIVar16->w == *(char *)&pIVar17->w),
           auVar24[0xd] = -(*(char *)((long)&pIVar16->w + 1) == *(char *)((long)&pIVar17->w + 1)),
           auVar24[0xe] = -(*(char *)((long)&pIVar16->w + 2) == *(char *)((long)&pIVar17->w + 2)),
           auVar24[0xf] = -(*(char *)((long)&pIVar16->w + 3) == *(char *)((long)&pIVar17->w + 3)),
           (ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar24[0xf] >> 7) << 0xf) != 0xffff)) {
          sVar10 = strlen(pcVar9);
          LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",(double)pIVar17->x
                  ,(double)pIVar17->y,(double)pIVar17->z,(double)pIVar17->w,pcVar9,
                  (ulong)(0x17 - (int)sVar10),"");
        }
        lVar13 = lVar13 + 1;
        pIVar16 = pIVar16 + 1;
        pIVar17 = pIVar17 + 1;
      } while (lVar13 != 0x2a);
      LogFinish();
    }
    SameLine(0.0,-1.0);
    PushItemWidth(120.0);
    Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
    PopItemWidth();
    SameLine(0.0,-1.0);
    Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
    Text(
        "Tip: Left-click on colored square to open color picker,\nRight-click to open edit options menu."
        );
    if (ShowStyleEditor(ImGuiStyle*)::filter == '\0') {
      iVar18 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter);
      if (iVar18 != 0) {
        ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
        __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
      }
    }
    ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",200.0);
    lVar13 = 0;
    RadioButton("Opaque",&ShowStyleEditor::alpha_flags,0);
    SameLine(0.0,-1.0);
    RadioButton("Alpha",&ShowStyleEditor::alpha_flags,0x400);
    SameLine(0.0,-1.0);
    RadioButton("Both",&ShowStyleEditor::alpha_flags,0x800);
    local_d0.x = 0.0;
    local_d0.y = 300.0;
    BeginChild("#colors",(ImVec2 *)&local_d0,true,0x80c000);
    PushItemWidth(-160.0);
    pIVar17 = v->Colors;
    pIVar16 = __dest->Colors;
    do {
      pcVar9 = GetStyleColorName((ImGuiCol)lVar13);
      bVar5 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,pcVar9,(char *)0x0);
      if (bVar5) {
        PushID((ImGuiCol)lVar13);
        ColorEdit4("##color",&pIVar17->x,ShowStyleEditor::alpha_flags | 0x200);
        auVar25[0] = -(*(char *)&pIVar16->x == *(char *)&pIVar17->x);
        auVar25[1] = -(*(char *)((long)&pIVar16->x + 1) == *(char *)((long)&pIVar17->x + 1));
        auVar25[2] = -(*(char *)((long)&pIVar16->x + 2) == *(char *)((long)&pIVar17->x + 2));
        auVar25[3] = -(*(char *)((long)&pIVar16->x + 3) == *(char *)((long)&pIVar17->x + 3));
        auVar25[4] = -(*(char *)&pIVar16->y == *(char *)&pIVar17->y);
        auVar25[5] = -(*(char *)((long)&pIVar16->y + 1) == *(char *)((long)&pIVar17->y + 1));
        auVar25[6] = -(*(char *)((long)&pIVar16->y + 2) == *(char *)((long)&pIVar17->y + 2));
        auVar25[7] = -(*(char *)((long)&pIVar16->y + 3) == *(char *)((long)&pIVar17->y + 3));
        auVar25[8] = -(*(char *)&pIVar16->z == *(char *)&pIVar17->z);
        auVar25[9] = -(*(char *)((long)&pIVar16->z + 1) == *(char *)((long)&pIVar17->z + 1));
        auVar25[10] = -(*(char *)((long)&pIVar16->z + 2) == *(char *)((long)&pIVar17->z + 2));
        auVar25[0xb] = -(*(char *)((long)&pIVar16->z + 3) == *(char *)((long)&pIVar17->z + 3));
        auVar25[0xc] = -(*(char *)&pIVar16->w == *(char *)&pIVar17->w);
        auVar25[0xd] = -(*(char *)((long)&pIVar16->w + 1) == *(char *)((long)&pIVar17->w + 1));
        auVar25[0xe] = -(*(char *)((long)&pIVar16->w + 2) == *(char *)((long)&pIVar17->w + 2));
        auVar25[0xf] = -(*(char *)((long)&pIVar16->w + 3) == *(char *)((long)&pIVar17->w + 3));
        if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff) {
          SameLine(0.0,(v->ItemInnerSpacing).x);
          local_d0.x = 0.0;
          local_d0.y = 0.0;
          bVar5 = Button("Save",(ImVec2 *)&local_d0);
          if (bVar5) {
            fVar22 = pIVar17->y;
            fVar23 = pIVar17->z;
            fVar4 = pIVar17->w;
            pIVar16->x = pIVar17->x;
            pIVar16->y = fVar22;
            pIVar16->z = fVar23;
            pIVar16->w = fVar4;
          }
          SameLine(0.0,(v->ItemInnerSpacing).x);
          local_d0.x = 0.0;
          local_d0.y = 0.0;
          bVar5 = Button("Revert",(ImVec2 *)&local_d0);
          if (bVar5) {
            fVar22 = pIVar16->y;
            fVar23 = pIVar16->z;
            fVar4 = pIVar16->w;
            pIVar17->x = pIVar16->x;
            pIVar17->y = fVar22;
            pIVar17->z = fVar23;
            pIVar17->w = fVar4;
          }
        }
        SameLine(0.0,(v->ItemInnerSpacing).x);
        TextUnformatted(pcVar9,(char *)0x0);
        PopID();
      }
      lVar13 = lVar13 + 1;
      pIVar16 = pIVar16 + 1;
      pIVar17 = pIVar17 + 1;
    } while (lVar13 != 0x2a);
    PopItemWidth();
    EndChild();
    TreePop();
  }
  pIVar11 = GetIO();
  bVar5 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(pIVar11->Fonts->Fonts).Size);
  if (bVar5) {
    pIVar11 = GetIO();
    pIVar21 = pIVar11->Fonts;
    bVar5 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)pIVar21->TexWidth,
                     (ulong)(uint)pIVar21->TexHeight);
    if (bVar5) {
      uVar1 = pIVar21->TexWidth;
      uVar2 = pIVar21->TexHeight;
      local_38.x = (float)(int)uVar1;
      local_38.y = (float)(int)uVar2;
      local_40.x = 0.0;
      local_40.y = 0.0;
      local_48.x = 1.0;
      local_48.y = 1.0;
      local_d0.x = 1.0;
      local_d0.y = 1.0;
      local_d0.z = 1.0;
      local_d0.w = 1.0;
      local_a8.x = 1.0;
      local_a8.y = 1.0;
      local_a8.z = 1.0;
      local_a8.w = 0.5019608;
      Image(pIVar21->TexID,&local_38,&local_40,&local_48,&local_d0,&local_a8);
      TreePop();
    }
    PushItemWidth(100.0);
    if (0 < (pIVar21->Fonts).Size) {
      uVar14 = 0;
      local_98 = pIVar21;
      do {
        pIVar20 = (pIVar21->Fonts).Data[uVar14];
        PushID(pIVar20);
        pcVar9 = pIVar20->ConfigData->Name;
        if (pIVar20->ConfigData == (ImFontConfig *)0x0) {
          pcVar9 = "";
        }
        local_c0 = pIVar20;
        bVar5 = TreeNode(pIVar20,"Font %d: \'%s\', %.2f px, %d glyphs",(double)pIVar20->FontSize,
                         uVar14 & 0xffffffff,pcVar9,(ulong)(uint)(pIVar20->Glyphs).Size);
        SameLine(0.0,-1.0);
        bVar6 = SmallButton("Set as default");
        if (bVar6) {
          pIVar11 = GetIO();
          pIVar11->FontDefault = local_c0;
        }
        pIVar20 = local_c0;
        if (bVar5) {
          PushFont(local_c0);
          Text("The quick brown fox jumps over the lazy dog");
          PopFont();
          DragFloat("Font scale",&pIVar20->Scale,0.005,0.3,2.0,"%.1f",1.0);
          InputFloat("Font offset",&(pIVar20->DisplayOffset).y,1.0,1.0,0,0);
          SameLine(0.0,-1.0);
          ShowHelpMarker(
                        "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)"
                        );
          Text("Ascent: %f, Descent: %f, Height: %f",(double)pIVar20->Ascent,
               (double)pIVar20->Descent,(double)(pIVar20->Ascent - pIVar20->Descent));
          Text("Fallback character: \'%c\' (%d)",(ulong)pIVar20->FallbackChar);
          uVar15 = pIVar20->MetricsTotalSurface;
          fVar22 = (float)(int)uVar15;
          if (fVar22 < 0.0) {
            fVar22 = sqrtf(fVar22);
          }
          else {
            fVar22 = SQRT(fVar22);
          }
          fVar23 = (float)local_c0->MetricsTotalSurface;
          local_90 = uVar14;
          if (fVar23 < 0.0) {
            local_b8 = (float *)CONCAT44(local_b8._4_4_,fVar22);
            fVar23 = sqrtf(fVar23);
            fVar22 = local_b8._0_4_;
          }
          else {
            fVar23 = SQRT(fVar23);
          }
          Text("Texture surface: %d pixels (approx) ~ %dx%d",(ulong)uVar15,(ulong)(uint)(int)fVar22,
               (ulong)(uint)(int)fVar23);
          sVar7 = local_c0->ConfigDataCount;
          if (0 < sVar7) {
            lVar13 = 0x4c;
            uVar14 = 0;
            do {
              pIVar20 = local_c0;
              pIVar3 = local_c0->ConfigData;
              if (pIVar3 != (ImFontConfig *)0x0) {
                BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d",
                           uVar14 & 0xffffffff,pIVar3->Name + lVar13 + -0x4c,
                           (ulong)*(uint *)(pIVar3->Name + lVar13 + -0x80),
                           (ulong)*(uint *)(pIVar3->Name + lVar13 + -0x7c),
                           (ulong)(byte)pIVar3->Name[lVar13 + -0x78]);
                sVar7 = pIVar20->ConfigDataCount;
              }
              uVar14 = uVar14 + 1;
              lVar13 = lVar13 + 0x80;
            } while ((long)uVar14 < (long)sVar7);
          }
          bVar5 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(local_c0->Glyphs).Size);
          if (bVar5) {
            ptr_id = (void *)0x0;
            pIVar20 = local_c0;
            do {
              iVar18 = 0;
              uVar15 = 0;
              do {
                pIVar12 = ImFont::FindGlyphNoFallback(pIVar20,(short)ptr_id + (short)iVar18);
                uVar15 = (uVar15 + 1) - (uint)(pIVar12 == (ImFontGlyph *)0x0);
                iVar18 = iVar18 + 1;
              } while (iVar18 != 0x100);
              if (uVar15 != 0) {
                pcVar9 = "glyphs";
                if (uVar15 == 1) {
                  pcVar9 = "glyph";
                }
                bVar5 = TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",(ulong)ptr_id & 0xffffffff,
                                 (ulong)((uint)ptr_id | 0xff),(ulong)uVar15,pcVar9);
                if (bVar5) {
                  local_b8 = (float *)CONCAT44(local_b8._4_4_,pIVar20->FontSize);
                  local_ac = (v->ItemSpacing).y + pIVar20->FontSize;
                  local_78 = GetCursorScreenPos();
                  local_80 = GetWindowDrawList();
                  local_68 = local_78.y;
                  fStack_64 = local_78.y;
                  fStack_60 = local_78.y;
                  fStack_5c = local_78.y;
                  uVar14 = 0;
                  local_88 = ptr_id;
                  do {
                    pIVar20 = local_c0;
                    uVar19 = (uint)uVar14;
                    local_d0.x = (float)(uVar19 & 0xf) * local_ac + local_78.x;
                    local_d0.y = (float)(int)(uVar14 >> 4) * local_ac + local_68;
                    local_a8.y = local_d0.y + local_b8._0_4_;
                    local_a8.x = local_d0.x + local_b8._0_4_;
                    uVar15 = (int)local_88 + uVar19;
                    c = (ImWchar)uVar15;
                    pIVar12 = ImFont::FindGlyphNoFallback(local_c0,c);
                    draw_list = local_80;
                    IVar8 = 0x64ffffff;
                    if (pIVar12 == (ImFontGlyph *)0x0) {
                      IVar8 = 0x32ffffff;
                    }
                    ImDrawList::AddRect(local_80,(ImVec2 *)&local_d0,(ImVec2 *)&local_a8,IVar8,0.0,
                                        0xf,1.0);
                    local_58.x = local_d0.x;
                    local_58.y = local_d0.y;
                    uStack_50 = 0;
                    IVar8 = GetColorU32(0,1.0);
                    ImFont::RenderChar(pIVar20,draw_list,local_b8._0_4_,local_58,IVar8,c);
                    if (pIVar12 != (ImFontGlyph *)0x0) {
                      bVar5 = IsMouseHoveringRect((ImVec2 *)&local_d0,(ImVec2 *)&local_a8,true);
                      if (bVar5) {
                        BeginTooltip();
                        Text("Codepoint: U+%04X",(ulong)uVar15);
                        Separator();
                        Text("AdvanceX: %.1f",(double)pIVar12->AdvanceX);
                        Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)pIVar12->X0,(double)pIVar12->Y0
                             ,(double)pIVar12->X1,(double)pIVar12->Y1);
                        Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)pIVar12->U0,(double)pIVar12->V0,
                             (double)pIVar12->U1,(double)pIVar12->V1);
                        EndTooltip();
                      }
                    }
                    ptr_id = local_88;
                    uVar14 = (ulong)(uVar19 + 1);
                  } while (uVar19 + 1 != 0x100);
                  local_d0.y = local_ac * 16.0;
                  local_d0.x = local_ac * 16.0;
                  Dummy((ImVec2 *)&local_d0);
                  TreePop();
                  pIVar20 = local_c0;
                }
              }
              bVar5 = ptr_id < (void *)0xff00;
              ptr_id = (void *)((long)ptr_id + 0x100);
            } while (bVar5);
            TreePop();
            pIVar21 = local_98;
          }
          TreePop();
          uVar14 = local_90;
        }
        PopID();
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)(pIVar21->Fonts).Size);
    }
    DragFloat("this window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.1f",1.0);
    pIVar11 = GetIO();
    DragFloat("global scale",&pIVar11->FontGlobalScale,0.005,0.3,2.0,"%.1f",1.0);
    PopItemWidth();
    SetWindowFontScale(ShowStyleEditor::window_scale);
    TreePop();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to (else it compares to an internally stored reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f")) 
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool window_border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &window_border)) style.WindowBorderSize = window_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool frame_border = (style.FrameBorderSize > 0.0f); if (ImGui::Checkbox("FrameBorder", &frame_border)) style.FrameBorderSize = frame_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool popup_border = (style.PopupBorderSize > 0.0f); if (ImGui::Checkbox("PopupBorder", &popup_border)) style.PopupBorderSize = popup_border ? 1.0f : 0.0f; }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    ShowHelpMarker("Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export Colors\" below to save them somewhere.");

    if (ImGui::TreeNode("Rendering"))
    {
        ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines); ImGui::SameLine(); ShowHelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");
        ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
        ImGui::PushItemWidth(100);
        ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, FLT_MAX, NULL, 2.0f);
        if (style.CurveTessellationTol < 0.0f) style.CurveTessellationTol = 0.10f;
        ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
        ImGui::PopItemWidth();
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Settings"))
    {
        ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 16.0f, "%.0f");
        ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
        ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
        ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
        ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
        ImGui::Text("BorderSize");
        ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::Text("Rounding");
        ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 14.0f, "%.0f");
        ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 16.0f, "%.0f");
        ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
        ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
        ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
        ImGui::Text("Alignment");
        ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
        ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); ShowHelpMarker("Alignment applies when a button is larger than its text content.");
        ImGui::Text("Safe Area Padding"); ImGui::SameLine(); ShowHelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
        ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Colors"))
    {
        static int output_dest = 0;
        static bool output_only_modified = true;
        if (ImGui::Button("Export Unsaved"))
        {
            if (output_dest == 0)
                ImGui::LogToClipboard();
            else
                ImGui::LogToTTY();
            ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const ImVec4& col = style.Colors[i];
                const char* name = ImGui::GetStyleColorName(i);
                if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                    ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE, name, 23-(int)strlen(name), "", col.x, col.y, col.z, col.w);
            }
            ImGui::LogFinish();
        }
        ImGui::SameLine(); ImGui::PushItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0"); ImGui::PopItemWidth();
        ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

        ImGui::Text("Tip: Left-click on colored square to open color picker,\nRight-click to open edit options menu.");

        static ImGuiTextFilter filter;
        filter.Draw("Filter colors", 200);

        static ImGuiColorEditFlags alpha_flags = 0;
        ImGui::RadioButton("Opaque", &alpha_flags, 0); ImGui::SameLine(); 
        ImGui::RadioButton("Alpha", &alpha_flags, ImGuiColorEditFlags_AlphaPreview); ImGui::SameLine(); 
        ImGui::RadioButton("Both", &alpha_flags, ImGuiColorEditFlags_AlphaPreviewHalf);

        ImGui::BeginChild("#colors", ImVec2(0, 300), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
        ImGui::PushItemWidth(-160);
        for (int i = 0; i < ImGuiCol_COUNT; i++)
        {
            const char* name = ImGui::GetStyleColorName(i);
            if (!filter.PassFilter(name))
                continue;
            ImGui::PushID(i);
            ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
            if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
            {
                // Tips: in a real user application, you may want to merge and use an icon font into the main font, so instead of "Save"/"Revert" you'd use icons.
                // Read the FAQ and misc/fonts/README.txt about using icon fonts. It's really easy and super convenient!
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) ref->Colors[i] = style.Colors[i];
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) style.Colors[i] = ref->Colors[i];
            }
            ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
            ImGui::TextUnformatted(name);
            ImGui::PopID();
        }
        ImGui::PopItemWidth();
        ImGui::EndChild();

        ImGui::TreePop();
    }

    bool fonts_opened = ImGui::TreeNode("Fonts", "Fonts (%d)", ImGui::GetIO().Fonts->Fonts.Size);
    if (fonts_opened)
    {
        ImFontAtlas* atlas = ImGui::GetIO().Fonts;
        if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
        {
            ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0,0), ImVec2(1,1), ImColor(255,255,255,255), ImColor(255,255,255,128));
            ImGui::TreePop();
        }
        ImGui::PushItemWidth(100);
        for (int i = 0; i < atlas->Fonts.Size; i++)
        {
            ImFont* font = atlas->Fonts[i];
            ImGui::PushID(font);
            bool font_details_opened = ImGui::TreeNode(font, "Font %d: \'%s\', %.2f px, %d glyphs", i, font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size);
            ImGui::SameLine(); if (ImGui::SmallButton("Set as default")) ImGui::GetIO().FontDefault = font;
            if (font_details_opened)
            {
                ImGui::PushFont(font);
                ImGui::Text("The quick brown fox jumps over the lazy dog");
                ImGui::PopFont();
                ImGui::DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");   // Scale only this font
                ImGui::InputFloat("Font offset", &font->DisplayOffset.y, 1, 1, 0);
                ImGui::SameLine(); ShowHelpMarker("Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)");
                ImGui::Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
                ImGui::Text("Fallback character: '%c' (%d)", font->FallbackChar, font->FallbackChar);
                ImGui::Text("Texture surface: %d pixels (approx) ~ %dx%d", font->MetricsTotalSurface, (int)sqrtf((float)font->MetricsTotalSurface), (int)sqrtf((float)font->MetricsTotalSurface));
                for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
                    if (ImFontConfig* cfg = &font->ConfigData[config_i])
                        ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d", config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH);
                if (ImGui::TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
                {
                    // Display all glyphs of the fonts in separate pages of 256 characters
                    for (int base = 0; base < 0x10000; base += 256)
                    {
                        int count = 0;
                        for (int n = 0; n < 256; n++)
                            count += font->FindGlyphNoFallback((ImWchar)(base + n)) ? 1 : 0;
                        if (count > 0 && ImGui::TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base+255, count, count > 1 ? "glyphs" : "glyph"))
                        {
                            float cell_size = font->FontSize * 1;
                            float cell_spacing = style.ItemSpacing.y;
                            ImVec2 base_pos = ImGui::GetCursorScreenPos();
                            ImDrawList* draw_list = ImGui::GetWindowDrawList();
                            for (int n = 0; n < 256; n++)
                            {
                                ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                                ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                                const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base+n));
                                draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255,255,255,100) : IM_COL32(255,255,255,50));
                                font->RenderChar(draw_list, cell_size, cell_p1, ImGui::GetColorU32(ImGuiCol_Text), (ImWchar)(base+n)); // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions available to generate a string.
                                if (glyph && ImGui::IsMouseHoveringRect(cell_p1, cell_p2))
                                {
                                    ImGui::BeginTooltip();
                                    ImGui::Text("Codepoint: U+%04X", base+n);
                                    ImGui::Separator();
                                    ImGui::Text("AdvanceX: %.1f", glyph->AdvanceX);
                                    ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                                    ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                                    ImGui::EndTooltip();
                                }
                            }
                            ImGui::Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
                            ImGui::TreePop();
                        }
                    }
                    ImGui::TreePop();
                }
                ImGui::TreePop();
            }
            ImGui::PopID();
        }
        static float window_scale = 1.0f;
        ImGui::DragFloat("this window scale", &window_scale, 0.005f, 0.3f, 2.0f, "%.1f");              // scale only this window
        ImGui::DragFloat("global scale", &ImGui::GetIO().FontGlobalScale, 0.005f, 0.3f, 2.0f, "%.1f"); // scale everything
        ImGui::PopItemWidth();
        ImGui::SetWindowFontScale(window_scale);
        ImGui::TreePop();
    }

    ImGui::PopItemWidth();
}